

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexReader::TiledFace::TiledFace
          (TiledFace *this,PtexReader *reader,Res resArg,Res tileresArg,int levelid)

{
  TiledFaceBase::TiledFaceBase(&this->super_TiledFaceBase,reader,resArg,tileresArg);
  (this->super_TiledFaceBase).super_FaceData.super_PtexFaceData._vptr_PtexFaceData =
       (_func_int **)&PTR__TiledFace_030139f8;
  this->_levelid = levelid;
  (this->_fdh).
  super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fdh).
  super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fdh).
  super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>::resize
            (&this->_fdh,(long)(this->super_TiledFaceBase)._ntiles);
  std::vector<long,_std::allocator<long>_>::resize
            (&this->_offsets,(long)(this->super_TiledFaceBase)._ntiles);
  return;
}

Assistant:

TiledFace(PtexReader* reader, Res resArg, Res tileresArg, int levelid)
            : TiledFaceBase(reader, resArg, tileresArg),
              _levelid(levelid)
        {
            _fdh.resize(_ntiles),
            _offsets.resize(_ntiles);
        }